

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::UnexpectedMethodCallException::UnexpectedMethodCallException
          (UnexpectedMethodCallException *this,string *format)

{
  *(undefined **)&(this->super_FakeitException).err = &__cxxabiv1::__pointer_type_info::vtable;
  (this->super_FakeitException)._vptr_FakeitException =
       (_func_int **)&PTR__UnexpectedMethodCallException_0012d090;
  std::__cxx11::string::string((string *)&this->_format,(string *)format);
  return;
}

Assistant:

UnexpectedMethodCallException(std::string format) :
                _format(format) {
        }